

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O0

int gimage::getViewImageName(string *image,char *name,char *spath,bool verbose)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  long lVar6;
  ulong uVar7;
  string *psVar8;
  reference pbVar9;
  ostream *poVar10;
  byte in_CL;
  char *in_RSI;
  string *in_RDI;
  bool bVar11;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar12;
  Exception *anon_var_0_3;
  int r;
  int ds_1;
  int d_1;
  long h_1;
  long w_1;
  size_t pos2;
  size_t pos_2;
  string s_1;
  iterator it_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  checked;
  IOException *anon_var_0_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flist_1;
  size_t i_1;
  int dd_1;
  long dh_1;
  long dw_1;
  size_t pos_1;
  bool tiled;
  string depthname_1;
  Exception *anon_var_0_1;
  int ds;
  int d;
  long h;
  long w;
  string s;
  iterator it;
  IOException *anon_var_0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flist;
  int dd;
  long dh;
  long dw;
  size_t pos;
  string depthname;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  int ret;
  int rating;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  ostream *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffabc;
  ostream *in_stack_fffffffffffffac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  undefined7 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffadf;
  bool local_46d;
  string local_448 [8];
  int *in_stack_fffffffffffffbc0;
  long *in_stack_fffffffffffffbc8;
  long *in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  int in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  long local_418;
  long local_410;
  _Self local_3f8;
  _Self local_3f0;
  string local_3e8 [8];
  char *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc30;
  string local_3c8 [24];
  string *in_stack_fffffffffffffc50;
  string *in_stack_fffffffffffffc58;
  undefined6 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc66;
  char in_stack_fffffffffffffc67;
  string *in_stack_fffffffffffffc68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc70;
  string local_388 [32];
  ulong local_368;
  ulong local_360;
  string local_358 [32];
  _Self local_338;
  _Self local_330;
  _Base_ptr local_328;
  undefined1 local_320;
  allocator local_2d9;
  string local_2d8 [80];
  string *psVar13;
  string *name_00;
  long local_278;
  long local_270;
  string local_258 [40];
  int local_230;
  int local_22c;
  long local_228;
  long local_220;
  string local_218 [32];
  _Self local_1f8;
  _Self local_1f0 [2];
  allocator local_1d9;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [84];
  int local_104;
  long local_100;
  long local_f8;
  byte local_e9;
  string local_e8 [32];
  long local_c8;
  string local_c0 [32];
  string local_a0 [32];
  ulong local_80;
  allocator local_61;
  string local_60 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  int local_24;
  int local_20;
  byte local_19;
  char *local_10;
  string *local_8;
  
  local_19 = in_CL & 1;
  local_20 = -1;
  local_24 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1751fd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,local_10,&local_61);
  gutil::split(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc67,
               (bool)in_stack_fffffffffffffc66);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::clear();
  for (local_80 = 1; uVar7 = local_80,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_40), uVar7 < sVar4; local_80 = local_80 + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_40,local_80);
    iVar3 = std::__cxx11::string::compare((ulong)pvVar5,0,(char *)0x2);
    if (iVar3 == 0) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_40,local_80);
      std::__cxx11::string::substr((ulong)local_a0,(ulong)pvVar5);
      std::__cxx11::string::operator=(local_8,local_a0);
      std::__cxx11::string::~string(local_a0);
      local_24 = 1;
    }
  }
  lVar6 = std::__cxx11::string::size();
  if (lVar6 == 0) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_40,0);
    std::__cxx11::string::string(local_c0,(string *)pvVar5);
    local_c8 = std::__cxx11::string::find_last_of((char *)local_c0,0x1ae50b);
    if (local_c8 == -1) {
      local_c8 = 0;
    }
    else {
      local_c8 = local_c8 + 1;
    }
    lVar6 = std::__cxx11::string::size();
    local_e9 = 0;
    local_46d = false;
    if (8 < (ulong)(lVar6 - local_c8)) {
      std::__cxx11::string::substr((ulong)local_e8,(ulong)local_c0);
      local_e9 = 1;
      local_46d = std::operator==(in_stack_fffffffffffffaa0,
                                  (char *)CONCAT44(in_stack_fffffffffffffa9c,
                                                   in_stack_fffffffffffffa98));
    }
    if ((local_e9 & 1) != 0) {
      std::__cxx11::string::~string(local_e8);
    }
    if (local_46d != false) {
      getImageIO();
      std::__cxx11::string::c_str();
      ImageIO::loadHeader((ImageIO *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                          (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                          in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                          in_stack_fffffffffffffbc0);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x175587);
      std::__cxx11::string::substr((ulong)local_1b8,(ulong)local_c0);
      std::operator+(in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
      std::__cxx11::string::operator[]((ulong)local_c0);
      std::operator+(in_stack_fffffffffffffaa8,(char)((ulong)in_stack_fffffffffffffaa0 >> 0x38));
      std::operator+(in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"",&local_1d9);
      gutil::getFileList((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffc67,
                                     CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)),
                         in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
      local_1f0[0]._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      while( true ) {
        local_1f8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        bVar1 = std::operator!=(local_1f0,&local_1f8);
        if (!bVar1) break;
        pbVar9 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffaa0);
        std::__cxx11::string::string(local_218,(string *)pbVar9);
        getImageIO();
        std::__cxx11::string::c_str();
        ImageIO::loadHeader((ImageIO *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0)
                            ,(char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                            in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                            in_stack_fffffffffffffbc0);
        local_230 = (int)((local_220 + local_f8 + -1) / local_f8);
        if (((local_220 + local_230 + -1) / (long)local_230 == local_f8) &&
           ((local_228 + local_230 + -1) / (long)local_230 == local_100)) {
          if ((local_19 & 1) != 0) {
            poVar10 = std::operator<<((ostream *)&std::cout,"Found suitable image: ");
            poVar10 = std::operator<<(poVar10,local_218);
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          }
          if (local_104 == 1) {
            std::__cxx11::string::operator=(local_8,local_218);
            local_104 = local_22c;
            local_24 = local_230;
          }
        }
        std::__cxx11::string::~string(local_218);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffaa0);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x175aaa);
    }
    std::__cxx11::string::~string(local_c0);
  }
  lVar6 = std::__cxx11::string::size();
  if (lVar6 == 0) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_40,0);
    std::__cxx11::string::string(local_258,(string *)pvVar5);
    bVar1 = false;
    uVar7 = std::__cxx11::string::rfind((char)local_258,0x3a);
    if ((uVar7 != 0xffffffffffffffff) &&
       (iVar3 = std::__cxx11::string::compare((ulong)local_258,uVar7,(char *)0x2), iVar3 != 0)) {
      bVar1 = true;
    }
    getImageIO();
    std::__cxx11::string::c_str();
    ImageIO::loadHeader((ImageIO *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                        (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                        in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                        in_stack_fffffffffffffbc0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x175c09);
    getPrefixAlternatives
              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    psVar13 = (string *)0x0;
    while( true ) {
      name_00 = psVar13;
      psVar8 = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&local_40);
      bVar11 = false;
      if (psVar13 < psVar8) {
        lVar6 = std::__cxx11::string::size();
        bVar11 = lVar6 == 0;
      }
      if (!bVar11) break;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x175ca2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_40,(size_type)name_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d8,"",&local_2d9);
      gutil::getFileList((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffc67,
                                     CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)),
                         in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x175db5);
      pVar12 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffac0,
                        (value_type *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8))
      ;
      local_328 = (_Base_ptr)pVar12.first._M_node;
      local_320 = pVar12.second;
      local_330._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      while( true ) {
        local_338._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        bVar11 = std::operator!=(&local_330,&local_338);
        if (!bVar11) break;
        pbVar9 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffaa0);
        std::__cxx11::string::string(local_358,(string *)pbVar9);
        if (bVar1) {
          local_360 = std::__cxx11::string::find_last_of((char *)local_358,0x1ae50b);
          if (local_360 == -1) {
            local_360 = 0;
          }
          local_360 = std::__cxx11::string::find((char)local_358,0x5f);
          if ((local_360 != 0xffffffffffffffff) &&
             (local_368 = std::__cxx11::string::rfind((char)local_358,0x5f), local_360 < local_368))
          {
            std::__cxx11::string::substr((ulong)local_3c8,(ulong)local_358);
            std::operator+(in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
            std::__cxx11::string::substr((ulong)local_3e8,(ulong)local_358);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
                           in_stack_fffffffffffffad0);
            std::__cxx11::string::operator=(local_358,local_388);
            std::__cxx11::string::~string(local_388);
            std::__cxx11::string::~string(local_3e8);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffc58);
            std::__cxx11::string::~string(local_3c8);
          }
        }
        local_3f0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
        local_3f8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        bVar2 = std::operator==(&local_3f0,&local_3f8);
        bVar11 = false;
        if (bVar2) {
          lVar6 = std::__cxx11::string::size();
          iVar3 = std::__cxx11::string::compare((ulong)local_358,lVar6 - 4,(char *)0x4);
          bVar11 = false;
          if (iVar3 != 0) {
            lVar6 = std::__cxx11::string::size();
            iVar3 = std::__cxx11::string::compare((ulong)local_358,lVar6 - 4,(char *)0x4);
            bVar11 = iVar3 != 0;
          }
        }
        if (bVar11) {
          pVar12 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffac0,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
          in_stack_fffffffffffffadf = pVar12.second;
          in_stack_fffffffffffffad0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)getImageIO();
          std::__cxx11::string::c_str();
          ImageIO::loadHeader((ImageIO *)
                              CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                              (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                              in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                              in_stack_fffffffffffffbc0);
          in_stack_fffffffffffffbe0 = (int)((local_410 + local_270 + -1) / local_270);
          if (((local_410 + in_stack_fffffffffffffbe0 + -1) / (long)in_stack_fffffffffffffbe0 ==
               local_270) &&
             ((local_418 + in_stack_fffffffffffffbe0 + -1) / (long)in_stack_fffffffffffffbe0 ==
              local_278)) {
            if ((local_19 & 1) != 0) {
              poVar10 = std::operator<<((ostream *)&std::cout,"Found suitable image: ");
              in_stack_fffffffffffffac0 = std::operator<<(poVar10,local_358);
              std::ostream::operator<<
                        (in_stack_fffffffffffffac0,std::endl<char,std::char_traits<char>>);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_40,(size_type)name_00);
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_448,(ulong)local_358);
            in_stack_fffffffffffffabc = anon_unknown_0::getTextureNameRating(name_00);
            std::__cxx11::string::~string(local_448);
            in_stack_fffffffffffffbdc = in_stack_fffffffffffffabc;
            if (local_20 < in_stack_fffffffffffffabc) {
              std::__cxx11::string::operator=(local_8,local_358);
              local_24 = in_stack_fffffffffffffbe0;
              local_20 = in_stack_fffffffffffffbdc;
            }
          }
        }
        std::__cxx11::string::~string(local_358);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffaa0);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x176448);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x176455);
      psVar13 = name_00 + 1;
    }
    std::__cxx11::string::~string(local_258);
  }
  if ((local_19 & 1) != 0) {
    lVar6 = std::__cxx11::string::size();
    if (lVar6 == 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,"No texture image found");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
    else {
      in_stack_fffffffffffffab0 = std::operator<<((ostream *)&std::cout,"Using texture image: ");
      poVar10 = std::operator<<(in_stack_fffffffffffffab0,local_8);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffab0);
  return local_24;
}

Assistant:

int getViewImageName(std::string &image, const char *name, const char *spath,
                     bool verbose)
{
  int rating=-1;
  int ret=0;

  // get image name from specification

  std::vector<std::string> list;

  gutil::split(list, name, ',');

  image.clear();

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 2, "i=") == 0)
    {
      image=list[i].substr(2);
      ret=1;
    }
  }

  // support format of Middlebury stereo benchmark data sets

  if (image.size() == 0)
  {
    std::string depthname=list[0];
    size_t pos;

    pos=depthname.find_last_of("/\\");

    if (pos == depthname.npos)
    {
      pos=0;
    }
    else
    {
      pos++;
    }

    if (depthname.size()-pos >= 9 && depthname.substr(pos, 4) == "disp")
    {
      long dw, dh;
      int  dd;

      getImageIO().loadHeader(depthname.c_str(), dw, dh, dd);

      // get list of all files with that prefix

      std::set<std::string> flist;

      try
      {
        gutil::getFileList(flist, depthname.substr(0, pos)+"im"+depthname[pos+4]+".", "");
      }
      catch (gutil::IOException &)
      { }

      // check list of files for images with the same size as the depth
      // image

      for (std::set<std::string>::iterator it=flist.begin(); it!=flist.end(); ++it)
      {
        std::string s=*it;

        // try to load image header and compare size to depth image

        try
        {
          long w, h;
          int  d;

          getImageIO().loadHeader(s.c_str(), w, h, d);

          int ds=(w+dw-1)/dw;
          if ((w+ds-1)/ds == dw && (h+ds-1)/ds == dh)
          {
            if (verbose)
            {
              std::cout << "Found suitable image: " << s << std::endl;
            }

            if (dd == 1)
            {
              image=s;
              dd=d;
              ret=ds;
            }
          }
        }
        catch (const gutil::Exception &)
        { }
      }
    }
  }

  // alternatively, search for image name

  if (image.size() == 0)
  {
    std::string depthname=list[0];
    bool tiled=false;

    size_t pos=depthname.rfind(':');

    if (pos != depthname.npos && depthname.compare(pos, 2, ":\\") != 0)
    {
      tiled=true;
    }

    long dw, dh;
    int  dd;

    getImageIO().loadHeader(depthname.c_str(), dw, dh, dd);
    dd=0;

    // go through list of prefixes

    list.clear();
    getPrefixAlternatives(list, depthname, spath);

    for (size_t i=0; i<list.size() && image.size() == 0; i++)
    {
      // get list of all files with that prefix

      std::set<std::string> flist;

      try
      {
        gutil::getFileList(flist, list[i], "");
      }
      catch (gutil::IOException &)
      { }

      // check list of files for images with the same size as the depth
      // image and prefer color images

      std::set<std::string> checked;
      checked.insert(depthname);

      for (std::set<std::string>::iterator it=flist.begin(); it!=flist.end(); ++it)
      {
        std::string s=*it;

        // if the depth image is a tiled image, then try to detect the
        // corresponding image as tiled

        if (tiled)
        {
          size_t pos=s.find_last_of("/\\");

          if (pos == s.npos)
          {
            pos=0;
          }

          pos=s.find('_', pos);

          if (pos != s.npos)
          {
            size_t pos2=s.rfind('_');

            if (pos2 > pos)
            {
              s=s.substr(0, pos)+":"+s.substr(pos2+1);
            }
          }
        }

        // try to load image header and compare size to depth image

        if (checked.find(s) == checked.end() &&
            s.compare(s.size()-4, 4, ".txt") != 0 &&
            s.compare(s.size()-4, 4, ".TXT") != 0)
        {
          checked.insert(s);

          try
          {
            long w, h;
            int  d;

            getImageIO().loadHeader(s.c_str(), w, h, d);

            int ds=(w+dw-1)/dw;
            if ((w+ds-1)/ds == dw && (h+ds-1)/ds == dh)
            {
              if (verbose)
              {
                std::cout << "Found suitable image: " << s << std::endl;
              }

              int r=getTextureNameRating(s.substr(list[i].size()));
              if (r > rating)
              {
                image=s;
                rating=r;
                ret=ds;
              }
            }
          }
          catch (const gutil::Exception &)
          { }
        }
      }
    }
  }

  if (verbose)
  {
    if (image.size() > 0)
    {
      std::cout << "Using texture image: " << image << std::endl;
    }
    else
    {
      std::cout << "No texture image found" << std::endl;
    }
  }

  return ret;
}